

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O3

void __thiscall cs::compiler_type::add_constant(compiler_type *this,var *val)

{
  proxy *ppVar1;
  
  if ((val->mDat == (proxy *)0x0) || (val->mDat->protect_level < 1)) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back(&this->constant_pool,val);
    cs_impl::any::protect
              ((this->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    ppVar1 = (this->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].mDat;
    if (ppVar1 != (proxy *)0x0) {
      ppVar1->is_rvalue = false;
    }
  }
  return;
}

Assistant:

void add_constant(const var &val)
		{
			if (!val.is_protect()) {
				constant_pool.push_back(val);
				constant_pool.back().protect();
				constant_pool.back().mark_as_rvalue(false);
			}
		}